

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TUDPTransport.h
# Opt level: O0

void __thiscall
jaegertracing::testutils::TUDPTransport::TUDPTransport(TUDPTransport *this,IPAddress *addr)

{
  int iVar1;
  HandleType __fd;
  socklen_t in_ECX;
  sockaddr *__addr;
  IPAddress local_138;
  int local_b0;
  socklen_t local_ac;
  int returnCode;
  socklen_t addrLen;
  sockaddr_storage addrStorage;
  IPAddress *addr_local;
  TUDPTransport *this_local;
  
  apache::thrift::transport::
  TVirtualTransport<jaegertracing::testutils::TUDPTransport,_apache::thrift::transport::TTransportDefaults>
  ::TVirtualTransport(&this->
                       super_TVirtualTransport<jaegertracing::testutils::TUDPTransport,_apache::thrift::transport::TTransportDefaults>
                     );
  (this->
  super_TVirtualTransport<jaegertracing::testutils::TUDPTransport,_apache::thrift::transport::TTransportDefaults>
  ).super_TTransportDefaults.super_TTransport._vptr_TTransport =
       (_func_int **)&PTR__TUDPTransport_003dd3c8;
  net::Socket::Socket(&this->_socket);
  memcpy(&this->_serverAddr,addr,0x88);
  net::IPAddress::IPAddress(&this->_clientAddr);
  net::Socket::open(&this->_socket,(char *)0x2,2);
  net::Socket::bind(&this->_socket,(int)this + 0x18,__addr,in_ECX);
  iVar1 = net::IPAddress::port(&this->_serverAddr);
  if (iVar1 == 0) {
    local_ac = 0x80;
    __fd = net::Socket::handle(&this->_socket);
    local_b0 = getsockname(__fd,(sockaddr *)&returnCode,&local_ac);
    if (local_b0 == 0) {
      net::IPAddress::IPAddress(&local_138,(sockaddr_storage *)&returnCode,local_ac);
      memcpy(&this->_serverAddr,&local_138,0x84);
    }
  }
  return;
}

Assistant:

explicit TUDPTransport(const net::IPAddress& addr)
        : _socket()
        , _serverAddr(addr)
    {
        _socket.open(AF_INET, SOCK_DGRAM);
        _socket.bind(_serverAddr);
        if (_serverAddr.port() == 0) {
            ::sockaddr_storage addrStorage;
            ::socklen_t addrLen = sizeof(addrStorage);
            const auto returnCode =
                ::getsockname(_socket.handle(),
                              reinterpret_cast<::sockaddr*>(&addrStorage),
                              &addrLen);
            if (returnCode == 0) {
                _serverAddr = net::IPAddress(addrStorage, addrLen);
            }
        }
    }